

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

wchar_t read__fixio(wchar_t fd,wchar_t e)

{
  uint uVar1;
  int iVar2;
  wchar_t e_local;
  wchar_t fd_local;
  
  if (e != L'\xffffffff') {
    if (e == L'\x04') {
      return L'\0';
    }
    if (e != L'\v') {
      return L'\xffffffff';
    }
  }
  uVar1 = fcntl(fd,3,0);
  if (uVar1 == 0xffffffff) {
    e_local = L'\xffffffff';
  }
  else {
    iVar2 = fcntl(fd,4,(ulong)(uVar1 & 0xfffff7ff));
    if (iVar2 == -1) {
      e_local = L'\xffffffff';
    }
    else {
      e_local = L'\0';
    }
  }
  return e_local;
}

Assistant:

static int
read__fixio(int fd __attribute__((__unused__)), int e)
{

	switch (e) {
	case -1:		/* Make sure that the code is reachable */

#ifdef EWOULDBLOCK
	case EWOULDBLOCK:
#ifndef TRY_AGAIN
#define TRY_AGAIN
#endif
#endif /* EWOULDBLOCK */

#if defined(POSIX) && defined(EAGAIN)
#if defined(EWOULDBLOCK) && EWOULDBLOCK != EAGAIN
	case EAGAIN:
#ifndef TRY_AGAIN
#define TRY_AGAIN
#endif
#endif /* EWOULDBLOCK && EWOULDBLOCK != EAGAIN */
#endif /* POSIX && EAGAIN */

		e = 0;
#ifdef TRY_AGAIN
#if defined(F_SETFL) && defined(O_NDELAY)
		if ((e = fcntl(fd, F_GETFL, 0)) == -1)
			return -1;

		if (fcntl(fd, F_SETFL, e & ~O_NDELAY) == -1)
			return -1;
		else
			e = 1;
#endif /* F_SETFL && O_NDELAY */

#ifdef FIONBIO
		{
			int zero = 0;

			if (ioctl(fd, FIONBIO, &zero) == -1)
				return -1;
			else
				e = 1;
		}
#endif /* FIONBIO */

#endif /* TRY_AGAIN */
		return e ? 0 : -1;

	case EINTR:
		return 0;

	default:
		return -1;
	}
}